

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O1

Vec_Int_t * Sle_ManComputeCuts(Gia_Man_t *p,int nLutSize,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vTemp;
  int *piVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 1000;
  vTemp->nSize = 0;
  piVar2 = (int *)malloc(4000);
  vTemp->pArray = piVar2;
  uVar8 = p->nObjs;
  iVar1 = (~(p->vCos->nSize + p->vCis->nSize) + uVar8) * 0x1e;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar2;
  if (6 < nLutSize) {
    __assert_fail("nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLE.c"
                  ,0xd2,"Vec_Int_t *Sle_ManComputeCuts(Gia_Man_t *, int, int)");
  }
  if (iVar4 < (int)uVar8) {
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      piVar2 = (int *)realloc(piVar2,(long)(int)uVar8 << 2);
    }
    p_00->pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset(p_00->pArray,0,(ulong)uVar8 * 4);
  }
  p_00->nSize = uVar8;
  pVVar3 = p->vCis;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      uVar8 = pVVar3->pArray[lVar5];
      if (((long)(int)uVar8 < 0) || (p->nObjs <= (int)uVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (uVar8 == 0) break;
      if (p_00->nSize <= (int)uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p_00->pArray[(int)uVar8] = p_00->nSize;
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,(0x10 << ((char)uVar8 +
                                 (char)((ulong)(uVar8 >> 2) * 0x24924925 >> 0x20) * -0x1c & 0x1fU))
                       + 1);
      Vec_IntPush(p_00,uVar8);
      lVar5 = lVar5 + 1;
      pVVar3 = p->vCis;
    } while (lVar5 < pVVar3->nSize);
  }
  iVar1 = p->nObjs;
  if (iVar1 < 1) {
    uVar8 = 0;
  }
  else {
    lVar7 = 0;
    lVar5 = 0;
    uVar8 = 0;
    do {
      uVar6 = *(uint *)(&p->pObjs->field_0x0 + lVar7);
      if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
        iVar1 = Sle_ManCutMerge(p,(int)lVar5,p_00,vTemp,nLutSize);
        uVar8 = uVar8 + iVar1;
      }
      lVar5 = lVar5 + 1;
      iVar1 = p->nObjs;
      lVar7 = lVar7 + 0xc;
    } while (lVar5 < iVar1);
  }
  if (fVerbose != 0) {
    uVar6 = ~(p->vCos->nSize + p->vCis->nSize) + iVar1;
    dVar9 = (double)(int)uVar6;
    iVar4 = p_00->nCap;
    auVar10._8_4_ = iVar4 >> 0x1f;
    auVar10._0_8_ = (long)iVar4;
    auVar10._12_4_ = 0x45300000;
    printf("Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.  Mem = %.2f MB.\n",
           (double)(int)uVar8 / dVar9,(double)(p_00->nSize - iVar1) / dVar9,
           (((auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) * 4.0 + 16.0) *
           9.5367431640625e-07,(ulong)uVar6,(ulong)uVar8);
  }
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (int *)0x0;
  }
  free(vTemp);
  return p_00;
}

Assistant:

Vec_Int_t * Sle_ManComputeCuts( Gia_Man_t * p, int nLutSize, int fVerbose )
{
    int i, iObj, nCuts = 0;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    assert( nLutSize <= 6 );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManForEachCiId( p, iObj, i )
    {
        Vec_IntWriteEntry( vCuts, iObj, Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 0 );
        Vec_IntPush( vCuts, Sle_CutSetSizeSign(1, 1<<(iObj % 28)) );
        Vec_IntPush( vCuts, iObj );
    }
    Gia_ManForEachAndId( p, iObj )
        nCuts += Sle_ManCutMerge( p, iObj, vCuts, vTemp, nLutSize );
    if ( fVerbose )
        printf( "Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.  Mem = %.2f MB.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 
            1.0*(Vec_IntSize(vCuts)-Gia_ManObjNum(p))/Gia_ManAndNum(p), 
            1.0*Vec_IntMemory(vCuts) / (1<<20) );
    Vec_IntFree( vTemp );
    return vCuts;
}